

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old __thiscall sc_dt::sc_string_old::uppercase(sc_string_old *this)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  sc_string_old *in_RSI;
  
  sVar3 = strlen(in_RSI->rep->str);
  sc_string_old(this,in_RSI);
  if (0 < (int)(uint)sVar3) {
    uVar4 = 0;
    do {
      pcVar2 = this->rep->str;
      cVar1 = pcVar2[uVar4];
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        pcVar2[uVar4] = cVar1 + -0x20;
      }
      uVar4 = uVar4 + 1;
    } while (((uint)sVar3 & 0x7fffffff) != uVar4);
  }
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::uppercase()const
{
    int len = length();
    sc_string_old temp(*this);
    for(int i=0; i<len; i++)
    {
	char c = temp.rep->str[i];
	if(c>='a' && c<='z')
	    temp.rep->str[i] = static_cast<char>( c-32 );
    }
    return temp;
}